

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * choc::text::FloatToStringBuffer<float>::writeAsExponentNotation
                 (char *dest,uint32_t totalLength,int exponent)

{
  int e;
  uint local_1c;
  int exponent_local;
  uint32_t totalLength_local;
  char *dest_local;
  
  if (totalLength == 1) {
    dest_local = writeExponent((FloatToStringBuffer<float> *)(dest + 1),
                               (char *)(ulong)(uint)exponent,exponent);
  }
  else {
    insertChar(dest + 1,totalLength - 1,'.',1);
    for (local_1c = totalLength; dest[local_1c] == '0' && 2 < local_1c; local_1c = local_1c - 1) {
    }
    dest_local = writeExponent((FloatToStringBuffer<float> *)(dest + (local_1c + 1)),
                               (char *)(ulong)(uint)exponent,e);
  }
  return dest_local;
}

Assistant:

static char* writeAsExponentNotation (char* dest, uint32_t totalLength, int exponent)
    {
        if (totalLength == 1)
            return writeExponent (dest + 1, exponent);

        insertChar (dest + 1, totalLength - 1, '.', 1);

        while (dest[totalLength] == '0' && totalLength > 2)
            --totalLength;

        return writeExponent (dest + (totalLength + 1), exponent);
    }